

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

void av1_tile_set_col(TileInfo *tile,AV1_COMMON *cm,int col)

{
  int iVar1;
  int iVar2;
  int local_20;
  int mi_col_end;
  int mi_col_start;
  int col_local;
  AV1_COMMON *cm_local;
  TileInfo *tile_local;
  
  iVar1 = (cm->tiles).col_start_sb[col];
  iVar2 = cm->seq_params->mib_size_log2;
  local_20 = (cm->tiles).col_start_sb[col + 1] << ((byte)cm->seq_params->mib_size_log2 & 0x1f);
  tile->tile_col = col;
  tile->mi_col_start = iVar1 << ((byte)iVar2 & 0x1f);
  if ((cm->mi_params).mi_cols <= local_20) {
    local_20 = (cm->mi_params).mi_cols;
  }
  tile->mi_col_end = local_20;
  return;
}

Assistant:

void av1_tile_set_col(TileInfo *tile, const AV1_COMMON *cm, int col) {
  assert(col < cm->tiles.cols);
  int mi_col_start = cm->tiles.col_start_sb[col]
                     << cm->seq_params->mib_size_log2;
  int mi_col_end = cm->tiles.col_start_sb[col + 1]
                   << cm->seq_params->mib_size_log2;
  tile->tile_col = col;
  tile->mi_col_start = mi_col_start;
  tile->mi_col_end = AOMMIN(mi_col_end, cm->mi_params.mi_cols);
  assert(tile->mi_col_end > tile->mi_col_start);
}